

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool mjs::is_strict_mode_directive(expression *e)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_18;
  
  iVar2 = (*(e->super_syntax_node)._vptr_syntax_node[3])();
  if ((iVar2 == 2) && (*(int *)&e[1].super_syntax_node._vptr_syntax_node == 4)) {
    uVar1 = (e->super_syntax_node).extend_.start;
    local_18._M_str =
         (((e->super_syntax_node).extend_.file.
           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->text_).
         _M_dataplus._M_p + uVar1;
    local_18._M_len = (size_t)((e->super_syntax_node).extend_.end - uVar1);
    iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_18,1,10,L"use strict");
    bVar3 = iVar2 == 0;
    if (bVar3) {
      iVar2 = *(int *)&e[1].super_syntax_node._vptr_syntax_node;
      if ((iVar2 != 2) && (iVar2 != 4)) {
        __assert_fail("has_text()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h"
                      ,0xd6,"const std::wstring &mjs::token::text() const");
      }
      iVar2 = std::__cxx11::wstring::compare((wchar_t *)&e[1].super_syntax_node.extend_);
      bVar3 = true;
      if (iVar2 != 0) {
        __assert_fail("le.t().text() == strict_directive",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0xc1,"bool mjs::is_strict_mode_directive(const expression &)");
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool is_strict_mode_directive(const expression& e) {
    if (!is_directive(e)) {
        return false;
    }
    const auto& le = static_cast<const literal_expression&>(e);
    // Check spelling of directive, "A Use Strict Directive may not contain an EscapeSequence or LineContinuation."
    if (le.extend().source_view().compare(1, sizeof(strict_directive)/sizeof(*strict_directive) -1, strict_directive) != 0) {
        return false;
    }
    assert(le.t().text() == strict_directive);
    return true;
}